

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_jumps.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_4b0c6::ir_lower_jumps_visitor::move_outer_block_inside
          (ir_lower_jumps_visitor *this,ir_instruction *ir,exec_list *inner_block)

{
  bool bVar1;
  exec_node *peVar2;
  ir_instruction *local_40;
  exec_node **local_38;
  ir_instruction *move_ir;
  exec_list *inner_block_local;
  ir_instruction *ir_local;
  ir_lower_jumps_visitor *this_local;
  
  local_40 = ir;
  while( true ) {
    peVar2 = exec_node::get_next(&ir->super_exec_node);
    bVar1 = exec_node::is_tail_sentinel(peVar2);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    peVar2 = exec_node::get_next(&ir->super_exec_node);
    if (peVar2 == (exec_node *)0x0) {
      local_38 = (exec_node **)0x0;
    }
    else {
      local_38 = &peVar2[-1].prev;
    }
    exec_node::remove((exec_node *)(local_38 + 1),(char *)local_40);
    local_40 = (ir_instruction *)0x0;
    if (local_38 != (exec_node **)0x0) {
      local_40 = (ir_instruction *)(local_38 + 1);
    }
    exec_list::push_tail(inner_block,(exec_node *)local_40);
  }
  return;
}

Assistant:

void move_outer_block_inside(ir_instruction *ir, exec_list *inner_block)
   {
      while (!ir->get_next()->is_tail_sentinel()) {
         ir_instruction *move_ir = (ir_instruction *)ir->get_next();

         move_ir->remove();
         inner_block->push_tail(move_ir);
      }
   }